

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

void __thiscall
cmListFileFunction::Implementation::Implementation
          (Implementation *this,string *name,long line,long lineEnd,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  long lineEnd_local;
  long line_local;
  string *name_local;
  Implementation *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  cmsys::SystemTools::LowerCase(&this->LowerCaseName,&this->OriginalName);
  this->Line = line;
  this->LineEnd = lineEnd;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
            (&this->Arguments,args);
  return;
}

Assistant:

Implementation(std::string name, long line, long lineEnd,
                   std::vector<cmListFileArgument> args)
      : OriginalName{ std::move(name) }
      , LowerCaseName{ cmSystemTools::LowerCase(this->OriginalName) }
      , Line{ line }
      , LineEnd{ lineEnd }
      , Arguments{ std::move(args) }
    {
    }